

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O3

void Vec_BitSetEntry(Vec_Bit_t *p,int i,int Entry)

{
  uint uVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  size_t __size;
  int iVar6;
  int iVar7;
  
  uVar4 = p->nSize;
  if (i < (int)uVar4) goto LAB_0066ab64;
  uVar5 = i + 1;
  uVar1 = p->nCap;
  iVar6 = (int)uVar5 >> 5;
  if (i < (int)(uVar1 * 2)) {
    if ((int)uVar1 <= i) {
      uVar4 = uVar1 & 0xf;
      iVar7 = (int)uVar1 >> 4;
LAB_0066aa99:
      iVar7 = (iVar7 + 1) - (uint)(uVar4 == 0);
      __size = (long)iVar7 << 2;
      if (p->pArray == (int *)0x0) {
        piVar2 = (int *)malloc(__size);
      }
      else {
        piVar2 = (int *)realloc(p->pArray,__size);
      }
      p->pArray = piVar2;
      if (piVar2 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
      }
      p->nCap = iVar7 * 0x20;
      uVar4 = p->nSize;
    }
  }
  else if ((int)uVar1 <= i) {
    uVar4 = uVar5 & 0x1f;
    iVar7 = iVar6;
    goto LAB_0066aa99;
  }
  if (i < (int)uVar4) {
    __assert_fail("p->nSize < nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                  ,0x19a,"void Vec_BitFillExtra(Vec_Bit_t *, int, int)");
  }
  iVar7 = (int)uVar4 >> 5;
  bVar3 = (byte)uVar5;
  if (iVar7 == iVar6) {
    p->pArray[iVar6] =
         p->pArray[iVar6] & ~(~(-1 << (bVar3 - (byte)uVar4 & 0x1f)) << ((byte)uVar4 & 0x1f));
  }
  else {
    piVar2 = p->pArray;
    piVar2[iVar7] = piVar2[iVar7] & (-(uint)((uVar4 & 0x1f) == 0) | ~(-1 << (sbyte)(uVar4 & 0x1f)));
    piVar2[iVar6] = ((uint)piVar2[iVar6] >> (bVar3 & 0x1f)) << (bVar3 & 0x1f);
    if (iVar7 + 1 < iVar6) {
      memset(piVar2 + (long)iVar7 + 1,0,(ulong)((iVar6 - iVar7) - 2) * 4 + 4);
    }
  }
  p->nSize = uVar5;
  uVar4 = uVar5;
LAB_0066ab64:
  if ((-1 < i) && (i < (int)uVar4)) {
    p->pArray[(uint)i >> 5] = p->pArray[(uint)i >> 5] | 1 << ((byte)i & 0x1f);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

static inline void Vec_BitSetEntry( Vec_Bit_t * p, int i, int Entry )
{
    Vec_BitFillExtra( p, i + 1, 0 );
    Vec_BitWriteEntry( p, i, Entry );
}